

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

int AF_AActor_TeleportMove
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  AActor *thing;
  DVector3 local_48;
  
  if (numparam < 1) {
    pcVar4 = "(paramnum) < numparam";
    goto LAB_0041d859;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0041d849:
    pcVar4 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0041d859:
    __assert_fail(pcVar4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                  ,0x1c8,
                  "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  thing = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (thing == (AActor *)0x0) goto LAB_0041d75c;
    bVar2 = DObject::IsKindOf((DObject *)thing,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar4 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0041d859;
    }
  }
  else {
    if (thing != (AActor *)0x0) goto LAB_0041d849;
LAB_0041d75c:
    thing = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar4 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\x01') {
      if ((uint)numparam < 3) {
        pcVar4 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\x01') {
          if (numparam == 3) {
            pcVar4 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\x01') {
              if ((uint)numparam < 5) {
                pcVar4 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
                  local_48.X = (double)param[1].field_0.field_1.a;
                  local_48.Y = (double)param[2].field_0.field_1.a;
                  local_48.Z = (double)param[3].field_0.field_1.a;
                  pVVar1 = param + 4;
                  if (numparam == 5) {
                    param = defaultparam->Array;
                    if (param[5].field_0.field_3.Type == '\0') {
LAB_0041d7f1:
                      bVar2 = P_TeleportMove(thing,&local_48,(pVVar1->field_0).i != 0,
                                             param[5].field_0.i != 0);
                      if (numret < 1) {
                        iVar3 = 0;
                      }
                      else {
                        if (ret == (VMReturn *)0x0) {
                          __assert_fail("ret != NULL",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                        ,0x1ce,
                                        "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                       );
                        }
                        VMReturn::SetInt(ret,(uint)bVar2);
                        iVar3 = 1;
                      }
                      return iVar3;
                    }
                    pcVar4 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') goto LAB_0041d7f1;
                    pcVar4 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                                ,0x1cd,
                                "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar4 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar4,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                            ,0x1cc,
                            "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar4 = "param[paramnum].Type == REGT_FLOAT";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                        ,0x1cb,
                        "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar4 = "param[paramnum].Type == REGT_FLOAT";
      }
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                    ,0x1ca,
                    "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar4 = "param[paramnum].Type == REGT_FLOAT";
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_map.cpp"
                ,0x1c9,
                "int AF_AActor_TeleportMove(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, TeleportMove)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(x);
	PARAM_FLOAT(y);
	PARAM_FLOAT(z);
	PARAM_BOOL(telefrag);
	PARAM_BOOL_DEF(modify);
	ACTION_RETURN_BOOL(P_TeleportMove(self, DVector3(x, y, z), telefrag, modify));
}